

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O1

RGB __thiscall pbrt::PixelSensor::IlluminantToSensorRGB(PixelSensor *this,SpectrumHandle *illum)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  Float FVar6;
  undefined1 extraout_var [60];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  RGB RVar11;
  DispatchSplit<6> local_99;
  float local_98;
  float local_94;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  PixelSensor *local_78;
  ulong local_70;
  undefined1 local_68 [16];
  SpectrumHandle *local_50;
  undefined1 local_48 [16];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  local_80 = (illum->
             super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             ).bits;
  uVar3 = (ulong)&this->r_bar | 0x2000000000000;
  uVar4 = local_80 >> 0x30;
  local_48._0_8_ = 0;
  local_48._8_8_ = 0;
  iVar2 = 0x168;
  local_88 = uVar3;
  local_78 = this;
  local_50 = illum;
  do {
    local_98 = (float)iVar2;
    local_90 = local_80;
    local_94 = local_98;
    FVar6 = detail::DispatchSplit<6>::operator()(&local_99,&local_98,&local_90,uVar4);
    local_68._0_4_ = FVar6;
    local_98 = local_94;
    local_90 = local_88;
    auVar7._0_4_ = detail::DispatchSplit<6>::operator()(&local_99,&local_98,&local_90,uVar3 >> 0x30)
    ;
    auVar7._4_60_ = extraout_var;
    local_48 = vfmadd231ss_fma(local_48,auVar7._0_16_,ZEXT416((uint)local_68._0_4_));
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x33f);
  local_88 = (local_50->
             super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             ).bits;
  uVar3 = (ulong)&local_78->g_bar | 0x2000000000000;
  uVar4 = local_88 >> 0x30;
  auVar7 = ZEXT864(0) << 0x20;
  iVar2 = 0x168;
  local_70 = uVar3;
  do {
    local_68 = auVar7._0_16_;
    local_98 = (float)iVar2;
    local_80 = CONCAT44(local_80._4_4_,local_98);
    local_90 = local_88;
    local_94 = detail::DispatchSplit<6>::operator()(&local_99,&local_98,&local_90,uVar4);
    local_98 = (float)local_80;
    local_90 = local_70;
    auVar8._0_4_ = detail::DispatchSplit<6>::operator()(&local_99,&local_98,&local_90,uVar3 >> 0x30)
    ;
    auVar8._4_60_ = extraout_var_00;
    local_68 = vfmadd231ss_fma(local_68,auVar8._0_16_,ZEXT416((uint)local_94));
    auVar7 = ZEXT1664(local_68);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x33f);
  local_70 = (local_50->
             super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             ).bits;
  uVar3 = (ulong)&local_78->b_bar | 0x2000000000000;
  local_78 = (PixelSensor *)(local_70 >> 0x30);
  auVar10 = ZEXT816(0) << 0x20;
  iVar2 = 0x168;
  do {
    local_94 = auVar10._0_4_;
    local_98 = (float)iVar2;
    local_88 = CONCAT44(local_88._4_4_,local_98);
    local_90 = local_70;
    FVar6 = detail::DispatchSplit<6>::operator()(&local_99,&local_98,&local_90,local_78);
    local_80 = CONCAT44(local_80._4_4_,FVar6);
    local_98 = (float)local_88;
    local_90 = uVar3;
    auVar9._0_4_ = detail::DispatchSplit<6>::operator()(&local_99,&local_98,&local_90,uVar3 >> 0x30)
    ;
    auVar9._4_60_ = extraout_var_01;
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)local_94),auVar9._0_16_,ZEXT416((uint)(float)local_80));
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x33f);
  auVar5 = vinsertps_avx(local_48,ZEXT416((uint)local_68._0_4_),0x10);
  auVar1._8_4_ = 0x42d5b6bb;
  auVar1._0_8_ = 0x42d5b6bb42d5b6bb;
  auVar1._12_4_ = 0x42d5b6bb;
  auVar5 = vdivps_avx512vl(auVar5,auVar1);
  auVar1 = vmovshdup_avx(auVar5);
  auVar5 = vdivps_avx(auVar5,auVar1);
  RVar11.b = (auVar10._0_4_ / 106.856895) / auVar1._0_4_;
  RVar11._0_8_ = auVar5._0_8_;
  return RVar11;
}

Assistant:

RGB IlluminantToSensorRGB(SpectrumHandle illum) const {
        RGB rgb(InnerProduct(illum, &r_bar), InnerProduct(illum, &g_bar),
                InnerProduct(illum, &b_bar));
        return rgb / rgb.g;
    }